

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_string.c
# Opt level: O3

void assert_not_parse_string(char *string)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  parse_buffer local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.offset = 0;
  local_48.depth = 0;
  local_48.content = (uchar *)string;
  sVar2 = strlen(string);
  local_48.length = sVar2 + 1;
  local_48.hooks.allocate = global_hooks.allocate;
  local_48.hooks.deallocate = global_hooks.deallocate;
  local_48.hooks.reallocate = global_hooks.reallocate;
  cVar1 = parse_string(item,&local_48);
  if (cVar1 != 0) {
    UnityFail("Malformed string should not be accepted.",0x43);
  }
  UnityAssertBits(0xff,0,(long)item[0].type,"Item doesn\'t have expected type.",0x44);
  if (item[0].next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x44);
  }
  if (item[0].prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x44);
  }
  if (item[0].child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x44);
  }
  if (item[0].string != (char *)0x0) {
    UnityFail("String is not NULL.",0x44);
  }
  if (item[0].valuestring == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    UnityFail("Valuestring is not NULL.",0x44);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_not_parse_string(const char * const string)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*)string;
    buffer.length = strlen(string) + sizeof("");
    buffer.hooks = global_hooks;

    TEST_ASSERT_FALSE_MESSAGE(parse_string(item, &buffer), "Malformed string should not be accepted.");
    assert_is_invalid(item);
}